

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O1

ExternalValueExpr * __thiscall
SQCompilation::CheckerVisitor::findExternalValue(CheckerVisitor *this,Expr *e)

{
  ExternalValueExpr *lhs;
  SQChar *ref;
  ValueRef *pVVar1;
  ExternalValueExpr *pEVar2;
  int32_t dummy_1;
  SQChar buffer [128];
  int32_t local_8c;
  int32_t local_88 [32];
  
  local_88[0] = 0xffffffff;
  lhs = (ExternalValueExpr *)maybeEval(this,e,local_88,true);
  if ((lhs->super_Expr).super_Node._op != TO_EXTERNAL_VALUE) {
    local_88[0x1c] = 0;
    local_88[0x1d] = 0;
    local_88[0x1e] = 0;
    local_88[0x1f] = 0;
    local_88[0x18] = 0;
    local_88[0x19] = 0;
    local_88[0x1a] = 0;
    local_88[0x1b] = 0;
    local_88[0x14] = 0;
    local_88[0x15] = 0;
    local_88[0x16] = 0;
    local_88[0x17] = 0;
    local_88[0x10] = 0;
    local_88[0x11] = 0;
    local_88[0x12] = 0;
    local_88[0x13] = 0;
    local_88[0xc] = 0;
    local_88[0xd] = 0;
    local_88[0xe] = 0;
    local_88[0xf] = 0;
    local_88[8] = 0;
    local_88[9] = 0;
    local_88[10] = 0;
    local_88[0xb] = 0;
    local_88[4] = 0;
    local_88[5] = 0;
    local_88[6] = 0;
    local_88[7] = 0;
    local_88[0] = 0;
    local_88[1] = 0;
    local_88[2] = 0;
    local_88[3] = 0;
    ref = computeNameRef(this,(Expr *)lhs,(SQChar *)local_88,0x80);
    if (((ref == (SQChar *)0x0) || (pVVar1 = findValueInScopes(this,ref), pVVar1 == (ValueRef *)0x0)
        ) || (1 < pVVar1->state - VRS_EXPRESSION)) {
      lhs = (ExternalValueExpr *)0x0;
    }
    else {
      local_8c = -1;
      pEVar2 = (ExternalValueExpr *)maybeEval(this,pVVar1->expression,&local_8c,true);
      lhs = (ExternalValueExpr *)0x0;
      if ((pEVar2->super_Expr).super_Node._op == TO_EXTERNAL_VALUE) {
        lhs = pEVar2;
      }
    }
  }
  return lhs;
}

Assistant:

const ExternalValueExpr *CheckerVisitor::findExternalValue(const Expr *e) {
  const Expr *ee = maybeEval(e, true);

  if (ee->op() == TO_EXTERNAL_VALUE)
    return static_cast<const ExternalValueExpr *>(ee);

  SQChar buffer[128] = { 0 };
  const SQChar *name = computeNameRef(ee, buffer, sizeof buffer);
  if (!name)
    return nullptr;

  const ValueRef *v = findValueInScopes(name);

  if (!v || !v->hasValue())
    return nullptr;

  const Expr *expr = maybeEval(v->expression, true);

  if (expr->op() == TO_EXTERNAL_VALUE)
    return static_cast<const ExternalValueExpr *>(expr);

  return nullptr;
}